

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 djb::brdf::d2_to_u2(vec2 *d)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = d->x;
  fVar5 = d->y;
  fVar4 = SQRT(fVar2 * fVar2 + fVar5 * fVar5);
  fVar2 = atan2f(fVar5,fVar2);
  fVar2 = (float)(~-(uint)(fVar2 < -0.7853982) & (uint)fVar2 |
                 (uint)(fVar2 + 6.2831855) & -(uint)(fVar2 < -0.7853982));
  if (0.7853982 <= fVar2) {
    if (2.3561945 <= fVar2) {
      fVar5 = -fVar4;
      if (3.926991 <= fVar2) {
        fVar3 = (fVar4 * (fVar2 + -4.712389)) / 0.7853982;
      }
      else {
        fVar3 = fVar5;
        fVar5 = ((fVar2 + -3.1415927) * fVar5) / 0.7853982;
      }
    }
    else {
      fVar3 = ((fVar2 + -1.5707964) * fVar4) / -0.7853982;
      fVar5 = fVar4;
    }
  }
  else {
    fVar3 = fVar4;
    fVar5 = (fVar4 * fVar2) / 0.7853982;
  }
  vVar1.y = (fVar5 + 1.0) * 0.5;
  vVar1.x = (fVar3 + 1.0) * 0.5;
  return vVar1;
}

Assistant:

vec2 brdf::d2_to_u2(const vec2 &d)
{
	float_t r = sqrt(d.x * d.x + d.y * d.y);
	float_t phi = atan2(d.y, d.x);
	float_t a, b;

	if (phi < -m_pi() / 4) {
		phi += 2 * m_pi();
	}

	if (phi < m_pi() / 4) {
		a = r;
		b = phi * a / (m_pi() / 4);
	} else if (phi < 3 * m_pi() / 4) {
		b = r;
		a = -(phi - m_pi() / 2) * b / (m_pi() / 4);
	} else if (phi < 5 * m_pi() / 4) {
		a = -r;
		b = (phi - m_pi()) * a / (m_pi() / 4);
	} else {
		b = -r;
		a = -(phi - 3 * m_pi() / 2) * b / (m_pi() / 4);
	}

	return (vec2(a, b) + vec2(1)) / 2;
}